

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_> * __thiscall
args::Command::GetAllFlags
          (vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_> *__return_storage_ptr__,
          Command *this)

{
  bool bVar1;
  uint uVar2;
  Options OVar3;
  vector<args::Base_*,_std::allocator<args::Base_*>_> *this_00;
  reference ppBVar4;
  iterator iVar5;
  iterator iVar6;
  __normal_iterator<args::FlagBase_**,_std::vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>_>
  local_f8;
  const_iterator local_f0;
  undefined1 local_e8 [8];
  vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_> childFlags_2;
  __normal_iterator<args::FlagBase_**,_std::vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>_>
  local_b8;
  const_iterator local_b0;
  undefined1 local_a8 [8];
  vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_> childFlags_1;
  __normal_iterator<args::FlagBase_**,_std::vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>_>
  local_78;
  const_iterator local_70;
  undefined1 local_58 [8];
  vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_> childFlags;
  Base *child;
  const_iterator __end2;
  const_iterator __begin2;
  vector<args::Base_*,_std::allocator<args::Base_*>_> *__range2;
  Command *this_local;
  vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_> *res;
  
  std::vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>::vector(__return_storage_ptr__);
  uVar2 = (*(this->super_Group).super_Base._vptr_Base[2])();
  if ((uVar2 & 1) != 0) {
    this_00 = Group::Children(&this->super_Group);
    __end2 = std::vector<args::Base_*,_std::allocator<args::Base_*>_>::begin(this_00);
    child = (Base *)std::vector<args::Base_*,_std::allocator<args::Base_*>_>::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
                                       *)&child), bVar1) {
      ppBVar4 = __gnu_cxx::
                __normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
                ::operator*(&__end2);
      childFlags.super__Vector_base<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)*ppBVar4;
      if (this->selectedCommand == (Command *)0x0) {
LAB_00249e1b:
        (**(code **)((long)&((*childFlags.
                               super__Vector_base<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage)->super_NamedBase)
                            .name.field_2 + 8))(local_58);
        local_78._M_current =
             (FlagBase **)
             std::vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>::end
                       (__return_storage_ptr__);
        __gnu_cxx::
        __normal_iterator<args::FlagBase*const*,std::vector<args::FlagBase*,std::allocator<args::FlagBase*>>>
        ::__normal_iterator<args::FlagBase**>
                  ((__normal_iterator<args::FlagBase*const*,std::vector<args::FlagBase*,std::allocator<args::FlagBase*>>>
                    *)&local_70,&local_78);
        iVar5 = std::vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>::begin
                          ((vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_> *)local_58);
        iVar6 = std::vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>::end
                          ((vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_> *)local_58);
        childFlags_1.super__Vector_base<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage =
             (pointer)std::vector<args::FlagBase*,std::allocator<args::FlagBase*>>::
                      insert<__gnu_cxx::__normal_iterator<args::FlagBase**,std::vector<args::FlagBase*,std::allocator<args::FlagBase*>>>,void>
                                ((vector<args::FlagBase*,std::allocator<args::FlagBase*>> *)
                                 __return_storage_ptr__,local_70,
                                 (__normal_iterator<args::FlagBase_**,_std::vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>_>
                                  )iVar5._M_current,
                                 (__normal_iterator<args::FlagBase_**,_std::vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>_>
                                  )iVar6._M_current);
        std::vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>::~vector
                  ((vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_> *)local_58);
      }
      else {
        OVar3 = Base::GetOptions((Base *)childFlags.
                                         super__Vector_base<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        OVar3 = operator&(OVar3,Global);
        if (OVar3 != None) goto LAB_00249e1b;
      }
      __gnu_cxx::
      __normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
      ::operator++(&__end2);
    }
    if (this->selectedCommand != (Command *)0x0) {
      (*(this->selectedCommand->super_Group).super_Base._vptr_Base[9])(local_a8);
      local_b8._M_current =
           (FlagBase **)
           std::vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>::end
                     (__return_storage_ptr__);
      __gnu_cxx::
      __normal_iterator<args::FlagBase*const*,std::vector<args::FlagBase*,std::allocator<args::FlagBase*>>>
      ::__normal_iterator<args::FlagBase**>
                ((__normal_iterator<args::FlagBase*const*,std::vector<args::FlagBase*,std::allocator<args::FlagBase*>>>
                  *)&local_b0,&local_b8);
      iVar5 = std::vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>::begin
                        ((vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_> *)local_a8);
      iVar6 = std::vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>::end
                        ((vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_> *)local_a8);
      childFlags_2.super__Vector_base<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::vector<args::FlagBase*,std::allocator<args::FlagBase*>>::
                    insert<__gnu_cxx::__normal_iterator<args::FlagBase**,std::vector<args::FlagBase*,std::allocator<args::FlagBase*>>>,void>
                              ((vector<args::FlagBase*,std::allocator<args::FlagBase*>> *)
                               __return_storage_ptr__,local_b0,
                               (__normal_iterator<args::FlagBase_**,_std::vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>_>
                                )iVar5._M_current,
                               (__normal_iterator<args::FlagBase_**,_std::vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>_>
                                )iVar6._M_current);
      std::vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>::~vector
                ((vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_> *)local_a8);
    }
    if (this->subparser != (Subparser *)0x0) {
      (*(this->subparser->super_Group).super_Base._vptr_Base[9])(local_e8);
      local_f8._M_current =
           (FlagBase **)
           std::vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>::end
                     (__return_storage_ptr__);
      __gnu_cxx::
      __normal_iterator<args::FlagBase*const*,std::vector<args::FlagBase*,std::allocator<args::FlagBase*>>>
      ::__normal_iterator<args::FlagBase**>
                ((__normal_iterator<args::FlagBase*const*,std::vector<args::FlagBase*,std::allocator<args::FlagBase*>>>
                  *)&local_f0,&local_f8);
      iVar5 = std::vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>::begin
                        ((vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_> *)local_e8);
      iVar6 = std::vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>::end
                        ((vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_> *)local_e8);
      std::vector<args::FlagBase*,std::allocator<args::FlagBase*>>::
      insert<__gnu_cxx::__normal_iterator<args::FlagBase**,std::vector<args::FlagBase*,std::allocator<args::FlagBase*>>>,void>
                ((vector<args::FlagBase*,std::allocator<args::FlagBase*>> *)__return_storage_ptr__,
                 local_f0,(__normal_iterator<args::FlagBase_**,_std::vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>_>
                           )iVar5._M_current,
                 (__normal_iterator<args::FlagBase_**,_std::vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>_>
                  )iVar6._M_current);
      std::vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>::~vector
                ((vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_> *)local_e8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::vector<FlagBase*> GetAllFlags() override
            {
                std::vector<FlagBase*> res;

                if (!Matched())
                {
                    return res;
                }

                for (auto *child: Children())
                {
                    if (selectedCommand == nullptr || (child->GetOptions() & Options::Global) != Options::None)
                    {
                        auto childFlags = child->GetAllFlags();
                        res.insert(res.end(), childFlags.begin(), childFlags.end());
                    }
                }

                if (selectedCommand != nullptr)
                {
                    auto childFlags = selectedCommand->GetAllFlags();
                    res.insert(res.end(), childFlags.begin(), childFlags.end());
                }

                if (subparser != nullptr)
                {
                    auto childFlags = subparser->GetAllFlags();
                    res.insert(res.end(), childFlags.begin(), childFlags.end());
                }

                return res;
            }